

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
yy::mylanguage_parser::yy_print_<yy::mylanguage_parser::by_state>
          (mylanguage_parser *this,ostream *yyo,basic_symbol<yy::mylanguage_parser::by_state> *yysym
          )

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  double *pdVar6;
  char *pcVar7;
  string local_50;
  
  lVar2 = (long)(yysym->super_by_state).state;
  if ((lVar2 != 0) && (cVar1 = *(char *)((long)&yystos_ + lVar2), cVar1 != -2)) {
    pcVar7 = "nterm";
    if (cVar1 < '\"') {
      pcVar7 = "token";
    }
    poVar3 = std::operator<<(yyo,pcVar7);
    poVar3 = std::operator<<(poVar3,' ');
    basic_symbol<yy::mylanguage_parser::by_state>::name_abi_cxx11_(&local_50,yysym);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3," (");
    pbVar4 = operator<<(poVar3,&yysym->location);
    std::operator<<(pbVar4,": ");
    std::__cxx11::string::~string((string *)&local_50);
    switch(cVar1) {
    case '\x1e':
    case ' ':
    case '!':
      pbVar5 = value_type::as<std::__cxx11::string>(&yysym->value);
      std::operator<<(yyo,(string *)pbVar5);
      break;
    case '\x1f':
      pdVar6 = value_type::as<double>(&yysym->value);
      std::ostream::_M_insert<double>(*pdVar6);
    }
    std::operator<<(yyo,')');
    return;
  }
  std::operator<<(yyo,"empty symbol");
  return;
}

Assistant:

void
  mylanguage_parser::yy_print_ (std::ostream& yyo, const basic_symbol<Base>& yysym) const
  {
    std::ostream& yyoutput = yyo;
    YY_USE (yyoutput);
    if (yysym.empty ())
      yyo << "empty symbol";
    else
      {
        symbol_kind_type yykind = yysym.kind ();
        yyo << (yykind < YYNTOKENS ? "token" : "nterm")
            << ' ' << yysym.name () << " ("
            << yysym.location << ": ";
        switch (yykind)
    {
      case symbol_kind::S_IDENTIFIER: // IDENTIFIER
#line 35 "src/parser.y"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 337 "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O2/parser.cpp"
        break;

      case symbol_kind::S_CONSTANT: // CONSTANT
#line 35 "src/parser.y"
                 { yyoutput << yysym.value.template as < double > (); }
#line 343 "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O2/parser.cpp"
        break;

      case symbol_kind::S_STRING_LITERAL: // STRING_LITERAL
#line 35 "src/parser.y"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 349 "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O2/parser.cpp"
        break;

      case symbol_kind::S_NAKED_ARG: // NAKED_ARG
#line 35 "src/parser.y"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 355 "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O2/parser.cpp"
        break;

      default:
        break;
    }
        yyo << ')';
      }
  }